

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

error_code llvm::sys::fs::is_other(Twine *Path,bool *Result)

{
  error_category *peVar1;
  error_code eVar2;
  file_status local_58;
  
  local_58.super_basic_file_status.fs_st_size._0_4_ = 0;
  local_58.super_basic_file_status._36_8_ = 0;
  local_58.super_basic_file_status.fs_st_atime_nsec = 0;
  local_58.super_basic_file_status.fs_st_mtime_nsec = 0;
  local_58.super_basic_file_status.fs_st_uid = 0;
  local_58.super_basic_file_status.fs_st_gid = 0;
  local_58.super_basic_file_status.fs_st_atime = 0;
  local_58.super_basic_file_status.fs_st_mtime = 0;
  eVar2 = status(Path,&local_58,true);
  peVar1 = eVar2._M_cat;
  if (eVar2._M_value == 0) {
    *Result = directory_file < local_58.super_basic_file_status.Type;
    peVar1 = (error_category *)std::_V2::system_category();
  }
  eVar2._4_4_ = 0;
  eVar2._M_cat = peVar1;
  return eVar2;
}

Assistant:

std::error_code is_other(const Twine &Path, bool &Result) {
  file_status FileStatus;
  if (std::error_code EC = status(Path, FileStatus))
    return EC;
  Result = is_other(FileStatus);
  return std::error_code();
}